

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_shared_mutex.hpp
# Opt level: O1

void __thiscall
yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::unlock_shared
          (shared_mutex_base<yamc::rwlock::ReaderPrefer> *this)

{
  id *piVar1;
  pointer piVar2;
  bool bVar3;
  int iVar4;
  __normal_iterator<std::thread::id_*,_std::vector<std::thread::id,_std::allocator<std::thread::id>_>_>
  _Var5;
  pointer piVar6;
  system_error *this_00;
  error_category *peVar7;
  error_code __ec;
  id tid;
  id local_28;
  pthread_t local_20;
  
  local_28._M_thread = pthread_self();
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx_);
  if (iVar4 == 0) {
    local_20 = local_28._M_thread;
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::thread::id*,std::vector<std::thread::id,std::allocator<std::thread::id>>>,__gnu_cxx::__ops::_Iter_equals_val<std::thread::id_const>>
                      ((this->s_owner_).
                       super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>._M_impl
                       .super__Vector_impl_data._M_start,
                       (this->s_owner_).
                       super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>._M_impl
                       .super__Vector_impl_data._M_finish);
    if (_Var5._M_current !=
        (this->s_owner_).super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      bVar3 = rwlock::ReaderPrefer::release_rlock(&this->state_);
      if (bVar3) {
        std::condition_variable::notify_all();
      }
      _Var5 = std::
              __remove_if<__gnu_cxx::__normal_iterator<std::thread::id*,std::vector<std::thread::id,std::allocator<std::thread::id>>>,__gnu_cxx::__ops::_Iter_equals_val<std::thread::id_const>>
                        ((this->s_owner_).
                         super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         (this->s_owner_).
                         super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_28);
      piVar1 = (this->s_owner_).
               super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((_Var5._M_current != piVar1) &&
         (piVar2 = (this->s_owner_).
                   super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>._M_impl.
                   super__Vector_impl_data._M_finish,
         piVar6 = (pointer)((long)_Var5._M_current + ((long)piVar2 - (long)piVar1)),
         piVar2 != piVar6)) {
        (this->s_owner_).super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>.
        _M_impl.super__Vector_impl_data._M_finish = piVar6;
      }
      validator::deadlock::unlocked((uintptr_t)this,local_28,true);
      pthread_mutex_unlock((pthread_mutex_t *)&this->mtx_);
      return;
    }
  }
  else {
    std::__throw_system_error(iVar4);
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  peVar7 = (error_category *)std::_V2::generic_category();
  __ec._M_cat = peVar7;
  __ec._0_8_ = 1;
  std::system_error::system_error(this_00,__ec,"invalid unlock_shared");
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void unlock_shared()
  {
    const auto tid = std::this_thread::get_id();
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    if (!is_shared_owner(tid)) {
      // owner thread
#if YAMC_CHECKED_CALL_ABORT
      std::abort();
#else
      throw std::system_error(std::make_error_code(std::errc::operation_not_permitted), "invalid unlock_shared");
#endif
    }
    if (RwLockPolicy::release_rlock(state_)) {
      cv_.notify_all();
    }
    auto result = std::remove(s_owner_.begin(), s_owner_.end(), tid);
    s_owner_.erase(result, s_owner_.end());
    validator::unlocked(reinterpret_cast<uintptr_t>(this), tid, true);
  }